

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial.h
# Opt level: O2

void __thiscall CBinomialHeap::InsertList(CBinomialHeap *this,CBinomialNode **otherRoot)

{
  CBinomialNode *pCVar1;
  CBinomialNode *pCVar2;
  CBinomialNode *pCVar3;
  CBinomialNode *pCVar4;
  CBinomialNode **ppCVar5;
  
  pCVar3 = *otherRoot;
  pCVar4 = (CBinomialNode *)0x0;
  ppCVar5 = &this->root_;
  do {
    pCVar1 = *ppCVar5;
    pCVar2 = pCVar3;
    while( true ) {
      pCVar3 = pCVar2;
      if ((pCVar1 == (CBinomialNode *)0x0) || (pCVar3 == (CBinomialNode *)0x0)) {
        if (pCVar3 != (CBinomialNode *)0x0) {
          pCVar4->next_ = pCVar3;
        }
        return;
      }
      if (pCVar1->degree_ <= pCVar3->degree_) break;
      ppCVar5 = &pCVar4->next_;
      if (pCVar4 == (CBinomialNode *)0x0) {
        ppCVar5 = &this->root_;
      }
      *ppCVar5 = pCVar3;
      pCVar2 = pCVar3->next_;
      pCVar3->next_ = pCVar1;
      pCVar4 = pCVar3;
    }
    ppCVar5 = &pCVar1->next_;
    pCVar4 = pCVar1;
  } while( true );
}

Assistant:

void InsertList(CBinomialNode*& otherRoot) {

        CBinomialNode *lefter = nullptr, *iter1 = root_, *iter2 = otherRoot, *temp;

        while (iter1 && iter2) {
            if (iter1->degree_ <= iter2->degree_) {
                lefter = iter1;
                iter1 = iter1->next_;
                continue;
            }
            if (lefter)
                lefter->next_ = iter2;
            else
                root_ = iter2;
            temp = iter2->next_;
            iter2->next_ = iter1;
            lefter = iter2;
            iter2 = temp;
        }

        if (iter2) {
            lefter->next_ = iter2;
        }
    }